

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

int __thiscall
gl4cts::SparseTextureAllocationTestCase::init
          (SparseTextureAllocationTestCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  value_type_conflict1 local_d8 [50];
  SparseTextureAllocationTestCase *local_10;
  SparseTextureAllocationTestCase *this_local;
  
  local_d8[0x31] = 0xde1;
  local_10 = this;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_d8 + 0x31);
  local_d8[0x30] = 0x8c1a;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_d8 + 0x30);
  local_d8[0x2f] = 0x8513;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_d8 + 0x2f);
  local_d8[0x2e] = 0x9009;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_d8 + 0x2e);
  local_d8[0x2d] = 0x806f;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_d8 + 0x2d);
  local_d8[0x2c] = 0x84f5;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_d8 + 0x2c);
  local_d8[0x2b] = 0x8c18;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mFullArrayTargets,local_d8 + 0x2b);
  local_d8[0x2a] = 0x8c1a;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mFullArrayTargets,local_d8 + 0x2a);
  local_d8[0x29] = 0x8513;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mFullArrayTargets,local_d8 + 0x29);
  local_d8[0x28] = 0x9009;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mFullArrayTargets,local_d8 + 0x28);
  local_d8[0x27] = 0x8229;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x27);
  local_d8[0x26] = 0x8f94;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x26);
  local_d8[0x25] = 0x822a;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x25);
  local_d8[0x24] = 0x8f98;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x24);
  local_d8[0x23] = 0x822b;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x23);
  local_d8[0x22] = 0x8f95;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x22);
  local_d8[0x21] = 0x822c;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x21);
  local_d8[0x20] = 0x8f99;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x20);
  local_d8[0x1f] = 0x8d62;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x1f);
  local_d8[0x1e] = 0x8058;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x1e);
  local_d8[0x1d] = 0x8f97;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x1d);
  local_d8[0x1c] = 0x8059;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x1c);
  local_d8[0x1b] = 0x906f;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x1b);
  local_d8[0x1a] = 0x805b;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x1a);
  local_d8[0x19] = 0x8f9b;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x19);
  local_d8[0x18] = 0x822d;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x18);
  local_d8[0x17] = 0x822f;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x17);
  local_d8[0x16] = 0x881a;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x16);
  local_d8[0x15] = 0x822e;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x15);
  local_d8[0x14] = 0x8230;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x14);
  local_d8[0x13] = 0x8814;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x13);
  local_d8[0x12] = 0x8c3a;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x12);
  local_d8[0x11] = 0x8c3d;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x11);
  local_d8[0x10] = 0x8231;
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->mSupportedInternalFormats,local_d8 + 0x10);
  local_d8[0xf] = 0x8232;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 0xf)
  ;
  local_d8[0xe] = 0x8233;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 0xe)
  ;
  local_d8[0xd] = 0x8234;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 0xd)
  ;
  local_d8[0xc] = 0x8235;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 0xc)
  ;
  local_d8[0xb] = 0x8236;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 0xb)
  ;
  local_d8[10] = 0x8237;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 10);
  local_d8[9] = 0x8238;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 9);
  local_d8[8] = 0x8239;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 8);
  local_d8[7] = 0x823a;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 7);
  local_d8[6] = 0x823b;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 6);
  local_d8[5] = 0x823c;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 5);
  local_d8[4] = 0x8d8e;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 4);
  local_d8[3] = 0x8d7c;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 3);
  local_d8[2] = 0x8d88;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 2);
  local_d8[1] = 0x8d76;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8 + 1);
  local_d8[0] = 0x8d82;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedInternalFormats,local_d8);
  return extraout_EAX;
}

Assistant:

void SparseTextureAllocationTestCase::init()
{
	mSupportedTargets.push_back(GL_TEXTURE_2D);
	mSupportedTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_3D);
	mSupportedTargets.push_back(GL_TEXTURE_RECTANGLE);

	mFullArrayTargets.push_back(GL_TEXTURE_1D_ARRAY);
	mFullArrayTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mFullArrayTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mFullArrayTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);

	mSupportedInternalFormats.push_back(GL_R8);
	mSupportedInternalFormats.push_back(GL_R8_SNORM);
	mSupportedInternalFormats.push_back(GL_R16);
	mSupportedInternalFormats.push_back(GL_R16_SNORM);
	mSupportedInternalFormats.push_back(GL_RG8);
	mSupportedInternalFormats.push_back(GL_RG8_SNORM);
	mSupportedInternalFormats.push_back(GL_RG16);
	mSupportedInternalFormats.push_back(GL_RG16_SNORM);
	mSupportedInternalFormats.push_back(GL_RGB565);
	mSupportedInternalFormats.push_back(GL_RGBA8);
	mSupportedInternalFormats.push_back(GL_RGBA8_SNORM);
	mSupportedInternalFormats.push_back(GL_RGB10_A2);
	mSupportedInternalFormats.push_back(GL_RGB10_A2UI);
	mSupportedInternalFormats.push_back(GL_RGBA16);
	mSupportedInternalFormats.push_back(GL_RGBA16_SNORM);
	mSupportedInternalFormats.push_back(GL_R16F);
	mSupportedInternalFormats.push_back(GL_RG16F);
	mSupportedInternalFormats.push_back(GL_RGBA16F);
	mSupportedInternalFormats.push_back(GL_R32F);
	mSupportedInternalFormats.push_back(GL_RG32F);
	mSupportedInternalFormats.push_back(GL_RGBA32F);
	mSupportedInternalFormats.push_back(GL_R11F_G11F_B10F);
	mSupportedInternalFormats.push_back(GL_RGB9_E5);
	mSupportedInternalFormats.push_back(GL_R8I);
	mSupportedInternalFormats.push_back(GL_R8UI);
	mSupportedInternalFormats.push_back(GL_R16I);
	mSupportedInternalFormats.push_back(GL_R16UI);
	mSupportedInternalFormats.push_back(GL_R32I);
	mSupportedInternalFormats.push_back(GL_R32UI);
	mSupportedInternalFormats.push_back(GL_RG8I);
	mSupportedInternalFormats.push_back(GL_RG8UI);
	mSupportedInternalFormats.push_back(GL_RG16I);
	mSupportedInternalFormats.push_back(GL_RG16UI);
	mSupportedInternalFormats.push_back(GL_RG32I);
	mSupportedInternalFormats.push_back(GL_RG32UI);
	mSupportedInternalFormats.push_back(GL_RGBA8I);
	mSupportedInternalFormats.push_back(GL_RGBA8UI);
	mSupportedInternalFormats.push_back(GL_RGBA16I);
	mSupportedInternalFormats.push_back(GL_RGBA16UI);
	mSupportedInternalFormats.push_back(GL_RGBA32I);
}